

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

uint32_t __thiscall icu_63::CollationData::getFinalCE32(CollationData *this,uint32_t ce32)

{
  uint uVar1;
  
  if ((~ce32 & 0xc0) == 0) {
    uVar1 = ce32 & 0xf;
    if (uVar1 == 0xd) {
      return 0xffffffff;
    }
    if (uVar1 == 0xb) {
      return *this->ce32s;
    }
    if (uVar1 == 10) {
      ce32 = this->ce32s[ce32 >> 0xd];
    }
  }
  return ce32;
}

Assistant:

uint32_t
CollationData::getFinalCE32(uint32_t ce32) const {
    if(Collation::isSpecialCE32(ce32)) {
        ce32 = getIndirectCE32(ce32);
    }
    return ce32;
}